

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String * __thiscall Bstrlib::String::operator=(String *this,uchar c)

{
  uchar *puVar1;
  int iVar2;
  
  iVar2 = (this->super_tagbstring).mlen;
  if (iVar2 < 1) {
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0xf9,"Write protection error");
    iVar2 = (this->super_tagbstring).mlen;
  }
  if (iVar2 < 3) {
    Alloc(this,2);
  }
  puVar1 = (this->super_tagbstring).data;
  if (puVar1 == (uchar *)0x0) {
    (this->super_tagbstring).mlen = 0;
    (this->super_tagbstring).slen = 0;
    fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
            "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
            ,0xfe,"Failure in =(char) operator");
  }
  else {
    (this->super_tagbstring).slen = 1;
    *puVar1 = c;
    (this->super_tagbstring).data[1] = '\0';
  }
  return this;
}

Assistant:

const String& String::operator=(unsigned char c)
    {
        if (mlen <= 0)    bstringThrow("Write protection error");
        if (2 >= mlen)    Alloc(2);
        if (!data)
        {
            mlen = slen = 0;
            bstringThrow("Failure in =(char) operator");
        }
        else
        {
            slen = 1;
            data[0] = c;
            data[1] = '\0';
        }
        return *this;
    }